

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O1

void __thiscall ON_FontList::Internal_UpdateSortedLists(ON_FontList *this)

{
  ON_wString *this_00;
  bool bVar1;
  ON_SHA1_Hash *pOVar2;
  wchar_t *pwVar3;
  undefined8 extraout_RAX;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  NameLocale name_locale;
  size_t new_capacity;
  ON_wString *src;
  ON_wString OVar6;
  ON_wString en;
  ON_Font *font;
  ON_SimpleArray<const_ON_Font_*> *sorted_lists [8];
  undefined1 local_c8 [16];
  ON__UINT8 local_b8 [8];
  ON_wString local_b0;
  ON_wString local_a8;
  ON_wString local_a0;
  ON_wString local_98;
  ON_wString local_90;
  ON_wString local_88;
  ON_wString local_80;
  ON_wString local_78 [3];
  ON_SimpleArray<const_ON_Font_*> *local_60;
  ON_SimpleArray<const_ON_Font_*> *local_58;
  ON_SimpleArray<const_ON_Font_*> *local_50;
  ON_SimpleArray<const_ON_Font_*> *local_48;
  ON_FontListImpl *local_40;
  
  OVar6.m_s = (wchar_t *)(long)(this->m_unsorted).m_count;
  if (0 < (long)OVar6.m_s) {
    local_40 = this->m_sorted;
    local_78[0].m_s = (wchar_t *)&local_40->m_by_postscript_name;
    local_78[1].m_s = (wchar_t *)&local_40->m_by_windows_logfont_name;
    local_78[2].m_s = (wchar_t *)&local_40->m_by_family_name;
    local_60 = &local_40->m_by_english_postscript_name;
    local_58 = &local_40->m_by_english_windows_logfont_name;
    local_50 = &local_40->m_by_english_family_name;
    local_48 = &local_40->m_by_quartet_name;
    pwVar4 = (wchar_t *)0x0;
    local_90.m_s = OVar6.m_s;
    do {
      local_a0.m_s = local_78[(long)pwVar4].m_s;
      new_capacity = (long)((ON_SimpleArray<const_ON_Font_*> *)local_a0.m_s)->m_count +
                     (long)OVar6.m_s;
      if ((uint)((ON_SimpleArray<const_ON_Font_*> *)local_a0.m_s)->m_capacity < (uint)new_capacity)
      {
        ON_SimpleArray<const_ON_Font_*>::SetCapacity
                  ((ON_SimpleArray<const_ON_Font_*> *)local_a0.m_s,new_capacity);
      }
      pwVar5 = (wchar_t *)0x0;
      local_80.m_s = pwVar4 & 0xffffffff;
      local_88.m_s = (wchar_t *)0x0;
      local_98.m_s = pwVar4;
      do {
        local_a8.m_s = (wchar_t *)(this->m_unsorted).m_a[(long)pwVar5];
        if ((ON_Font *)local_a8.m_s == (ON_Font *)0x0) goto LAB_00481296;
        if (7 < (uint)local_98.m_s) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                     ,0xfb9,"",
                     "When you add an array to ON_FontListImpl, you must add a corresponding if clause here."
                    );
          goto LAB_00481280;
        }
        name_locale = (NameLocale)local_a8.m_s;
        switch((long)&switchD_00481045::switchdataD_006bdfe4 +
               (long)(int)(&switchD_00481045::switchdataD_006bdfe4)[(long)local_80.m_s]) {
        case 0x481047:
          ON_Font::PostScriptName((ON_Font *)local_c8,name_locale);
          bVar1 = ON_wString::IsEmpty((ON_wString *)local_c8);
          break;
        case 0x481065:
          ON_wString::ON_wString
                    ((ON_wString *)local_c8,&((ON_Font *)local_a8.m_s)->m_en_windows_logfont_name);
          bVar1 = ON_wString::IsEmpty((ON_wString *)local_c8);
          if (!bVar1) {
            pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_c8);
            ON_wString::ON_wString(&local_b0,(ON_wString *)(local_a8.m_s + 0x18));
            pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_b0);
            bVar1 = ON_wString::EqualOrdinal(pwVar4,pwVar3,true);
            goto LAB_00481266;
          }
          goto LAB_004811b0;
        case 0x4810c5:
          ON_Font::FamilyName((ON_Font *)local_c8,name_locale);
          bVar1 = ON_wString::IsEmpty((ON_wString *)local_c8);
          break;
        case 0x4810e3:
          ON_wString::ON_wString
                    ((ON_wString *)local_c8,&((ON_Font *)local_a8.m_s)->m_en_postscript_name);
          bVar1 = ON_wString::IsEmpty((ON_wString *)local_c8);
          if (bVar1) goto LAB_004811b0;
          pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_c8);
          ON_wString::ON_wString(&local_b0,(ON_wString *)(local_a8.m_s + 0xc));
          pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_b0);
          bVar1 = ON_wString::EqualOrdinal(pwVar4,pwVar3,true);
LAB_00481266:
          ON_wString::~ON_wString(&local_b0);
          break;
        case 0x481143:
          pOVar2 = ON_Font::FontCharacteristicsHash((ON_Font *)local_a8.m_s);
          local_c8._0_8_ = *(undefined8 *)pOVar2->m_digest;
          local_c8._8_8_ = *(undefined8 *)(pOVar2->m_digest + 8);
          local_b8._0_4_ = *(undefined4 *)(pOVar2->m_digest + 0x10);
          bVar1 = ON_SHA1_Hash::IsZeroDigestOrEmptyContentHash((ON_SHA1_Hash *)local_c8);
          if (!bVar1) goto LAB_00481280;
          goto LAB_00481296;
        case 0x48116e:
          ON_Font::WindowsLogfontName((ON_Font *)local_c8,name_locale);
          bVar1 = ON_wString::IsEmpty((ON_wString *)local_c8);
          break;
        case 0x481192:
          ON_wString::ON_wString
                    ((ON_wString *)local_c8,&((ON_Font *)local_a8.m_s)->m_en_family_name);
          bVar1 = ON_wString::IsEmpty((ON_wString *)local_c8);
          if (!bVar1) {
            pwVar4 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)local_c8);
            ON_wString::ON_wString(&local_b0,(ON_wString *)(local_a8.m_s + 0x10));
            pwVar3 = ON_wString::operator_cast_to_wchar_t_(&local_b0);
            bVar1 = ON_wString::EqualOrdinal(pwVar4,pwVar3,true);
            goto LAB_00481266;
          }
LAB_004811b0:
          ON_wString::~ON_wString((ON_wString *)local_c8);
          goto LAB_00481296;
        case 0x4811bd:
          this_00 = &((ON_Font *)local_a8.m_s)->m_loc_windows_logfont_name;
          src = &((ON_Font *)local_a8.m_s)->m_en_windows_logfont_name;
          bVar1 = ON_wString::IsNotEmpty(this_00);
          if (bVar1) {
            src = this_00;
          }
          ON_wString::ON_wString((ON_wString *)local_c8,src);
          bVar1 = ON_wString::IsEmpty((ON_wString *)local_c8);
          if (!bVar1) {
            if (-1 < (this->m_quartet_list).m_capacity) {
              (this->m_quartet_list).m_count = 0;
            }
            ON_wString::~ON_wString((ON_wString *)local_c8);
            OVar6.m_s = local_90.m_s;
            goto LAB_00481280;
          }
          ON_wString::~ON_wString((ON_wString *)local_c8);
          OVar6.m_s = local_90.m_s;
          goto LAB_00481296;
        }
        ON_wString::~ON_wString((ON_wString *)local_c8);
        if (bVar1 == false) {
LAB_00481280:
          ON_SimpleArray<const_ON_Font_*>::Append
                    ((ON_SimpleArray<const_ON_Font_*> *)local_a0.m_s,(ON_Font **)&local_a8);
          local_88.m_s = (wchar_t *)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
LAB_00481296:
        pwVar5 = (wchar_t *)((long)pwVar5 + 1);
      } while (OVar6.m_s != pwVar5);
      if (((ulong)local_88.m_s & 1) != 0) {
        ON_SimpleArray<const_ON_Font_*>::QuickSort
                  ((ON_SimpleArray<const_ON_Font_*> *)local_a0.m_s,
                   (_func_int_ON_Font_ptr_ptr_ON_Font_ptr_ptr *)
                   (&PTR_Internal_ComparePostScriptNameEtc_0081e730)[(long)local_98.m_s]);
      }
      pwVar4 = local_98.m_s + 1;
    } while (pwVar4 != (wchar_t *)0x8);
    if (-1 < (this->m_unsorted).m_capacity) {
      (this->m_unsorted).m_count = 0;
    }
  }
  return;
}

Assistant:

const ON__UINT8* ON_PANOSE1::TenBytes() const
{
  return (const ON__UINT8*)(&m_family_kind);
}